

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ValueFederateManager::ValueFederateManager
          (ValueFederateManager *this,Core *coreOb,ValueFederate *vfed,LocalFederateId id,
          bool singleThreaded)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  *this_00;
  double in_stack_ffffffffffffff98;
  undefined1 enableLocking;
  bool enableLocking_00;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_stack_ffffffffffffffa0;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = in_ECX;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::shared_guarded_opt(in_stack_ffffffffffffffa0,SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::shared_guarded_opt
            ((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              *)in_stack_ffffffffffffffa0,SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  enableLocking = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  *(undefined8 *)(in_RDI + 0x200) = in_RSI;
  *(undefined8 *)(in_RDI + 0x208) = in_RDX;
  gmlc::libguarded::
  atomic_guarded<std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
  ::atomic_guarded<>((atomic_guarded<std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
                      *)in_stack_ffffffffffffffa0);
  this_00 = (shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
             *)(in_RDI + 600);
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  ::shared_guarded_opt(this_00,(bool)enableLocking);
  enableLocking_00 = SUB81((ulong)(in_RDI + 0x2e8) >> 0x38,0);
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::shared_guarded_opt
            ((shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
              *)this_00,enableLocking_00);
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::shared_guarded_opt
            ((shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
              *)this_00,enableLocking_00);
  return;
}

Assistant:

ValueFederateManager::ValueFederateManager(Core* coreOb,
                                           ValueFederate* vfed,
                                           LocalFederateId id,
                                           bool singleThreaded):
    fedID(id), inputs(!singleThreaded), publications(!singleThreaded), coreObject(coreOb),
    fed(vfed), inputData(!singleThreaded), targetIDs(!singleThreaded), inputTargets(!singleThreaded)
{
}